

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O0

defV * __thiscall
helics::apps::RampGenerator::generate_abi_cxx11_(RampGenerator *this,Time signalTime)

{
  baseType in_RDX;
  TimeRepresentation<count_time<9,_long>_> *in_RSI;
  defV *in_RDI;
  double newVal;
  double *in_stack_ffffffffffffffa8;
  TimeRepresentation<count_time<9,_long>_> t;
  
  t.internalTimeCode = in_RSI[8].internalTimeCode;
  TimeRepresentation<count_time<9,_long>_>::operator-
            (in_RSI,(TimeRepresentation<count_time<9,_long>_> *)t.internalTimeCode);
  ::operator*((double)in_stack_ffffffffffffffa8,t);
  in_RSI[1].internalTimeCode = in_RDX;
  std::
  variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
  ::variant<double,void,void,double,void>
            ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
              *)t.internalTimeCode,in_stack_ffffffffffffffa8);
  return in_RDI;
}

Assistant:

defV RampGenerator::generate(Time signalTime)
    {
        double newVal = level + ramp * (signalTime - keyTime);
        lastTime = signalTime;
        return newVal;
    }